

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O0

int crypt_encrypt_chacha20_poly_buffer
              (LIBSSH2_SESSION *session,uint seqno,uchar *buf,size_t buf_len,void **abstract,
              int firstlast)

{
  int *piVar1;
  crypt_ctx *ctx;
  int ret;
  int firstlast_local;
  void **abstract_local;
  size_t buf_len_local;
  uchar *buf_local;
  uint seqno_local;
  LIBSSH2_SESSION *session_local;
  
  ctx._0_4_ = 1;
  piVar1 = (int *)*abstract;
  if (piVar1 != (int *)0x0) {
    if (*piVar1 == 0) {
      ctx._0_4_ = chachapoly_crypt((chachapoly_ctx *)(piVar1 + 6),seqno,buf,buf,(u_int)buf_len,4,
                                   *piVar1);
      if ((int)ctx == 0) {
        memmove(buf,buf + 4,buf_len - 4);
      }
    }
    else {
      ctx._0_4_ = chachapoly_crypt((chachapoly_ctx *)(piVar1 + 6),seqno,buf,buf,(u_int)buf_len - 4,4
                                   ,*piVar1);
    }
  }
  return (uint)((int)ctx != 0);
}

Assistant:

static int
crypt_encrypt_chacha20_poly_buffer(LIBSSH2_SESSION * session,
                                   unsigned int seqno,
                                   unsigned char *buf,
                                   size_t buf_len,
                                   void **abstract,
                                   int firstlast)
{
    int ret = 1;
    struct crypt_ctx *ctx = *(struct crypt_ctx **) abstract;

    (void)session;
    (void)firstlast;

    if(ctx) {
        if(ctx->encrypt) {
            /* requires out_buf to be large enough to hold encrypted output
               plus auth tag (auth len)

               buf is a full packet so we need to subtract packet length from
               length
             */
            ret = chachapoly_crypt(&ctx->chachapoly_ctx, seqno, buf, buf,
                                   ((u_int)buf_len) - 4, 4, ctx->encrypt);
        }
        else {
            /* buf is full packet including size and auth tag but buf_len
               doesn't include size */
            ret = chachapoly_crypt(&ctx->chachapoly_ctx, seqno, buf, buf,
                                   ((u_int)buf_len), 4, ctx->encrypt);

            /* the api expects the size field to already be removed
               from the decrypted packet so we'll help it out */
            if(ret == 0) {
                memmove(buf, buf + 4, buf_len - 4);
            }
        }
    }

    return (ret == 0 ? 0 : 1);
}